

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuWorker.cpp
# Opt level: O2

void __thiscall xmrig::CpuWorker<5UL>::start(CpuWorker<5UL> *this)

{
  uint64_t *puVar1;
  WorkerJob<5UL> *this_00;
  Job *job;
  byte bVar2;
  cn_hash_fun p_Var3;
  size_t i;
  long lVar4;
  uint8_t *result;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  
  this_00 = &this->m_job;
  do {
    if (Nonce::m_sequence == 0) {
      return;
    }
    if ((Nonce::m_paused & 1) != 0) {
      do {
        local_38.__r = 200;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_38);
        if ((Nonce::m_paused & 1) == 0) break;
      } while (Nonce::m_sequence != 0);
      if (Nonce::m_sequence == 0) {
        return;
      }
      consumeJob(this);
    }
    while (Nonce::m_sequence == (this->m_job).m_sequence) {
      if (((this->super_Worker).m_count & 7) == 0) {
        Worker::storeStats(&this->super_Worker);
      }
      bVar2 = (this->m_job).m_index;
      job = (this->m_job).m_jobs + bVar2;
      p_Var3 = fn(this);
      (*p_Var3)(this_00->m_blobs[(this->m_job).m_index],(this->m_job).m_jobs[bVar2].m_size,
                this->m_hash,this->m_ctx,(this->m_job).m_jobs[bVar2].m_height,
                (this->m_job).m_jobs[bVar2].m_extraIters);
      result = this->m_hash;
      for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
        if (*(ulong *)(result + 0x18) < job->m_target) {
          bVar2 = (this->m_job).m_index;
          JobResults::submit(job,*(uint32_t *)
                                  (this_00->m_blobs[bVar2] +
                                  (this->m_job).m_jobs[bVar2].m_size * lVar4 + 0x27),result);
        }
        result = result + 0x20;
      }
      WorkerJob<5UL>::nextRound(this_00,0x8000,1);
      puVar1 = &(this->super_Worker).m_count;
      *puVar1 = *puVar1 + 5;
      sched_yield();
    }
    consumeJob(this);
  } while( true );
}

Assistant:

void xmrig::CpuWorker<N>::start()
{
    while (Nonce::sequence(Nonce::CPU) > 0) {
        if (Nonce::isPaused()) {
            do {
                std::this_thread::sleep_for(std::chrono::milliseconds(200));
            }
            while (Nonce::isPaused() && Nonce::sequence(Nonce::CPU) > 0);

            if (Nonce::sequence(Nonce::CPU) == 0) {
                break;
            }

            consumeJob();
        }

        while (!Nonce::isOutdated(Nonce::CPU, m_job.sequence())) {
            if ((m_count & 0x7) == 0) {
                storeStats();
            }

            const Job &job = m_job.currentJob();

            fn()(m_job.blob(), job.size(), m_hash, m_ctx, job.height(), job.extraIters());

            for (size_t i = 0; i < N; ++i) {
                if (*reinterpret_cast<uint64_t*>(m_hash + (i * 32) + 24) < job.target()) {
                    JobResults::submit(job, *m_job.nonce(i), m_hash + (i * 32));
                }
            }

            m_job.nextRound(kReserveCount, 1);
            m_count += N;

            std::this_thread::yield();
        }

        consumeJob();
    }
}